

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# users.h
# Opt level: O1

UserSet * __thiscall wasm::DataFlow::Users::getUsers(Users *this,Node *node)

{
  ulong uVar1;
  UserSet *in_RAX;
  _Hash_node_base *p_Var2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  UserSet *local_18;
  
  uVar1 = (this->users)._M_h._M_bucket_count;
  uVar3 = (ulong)node % uVar1;
  p_Var4 = (this->users)._M_h._M_buckets[uVar3];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var4->_M_nxt, p_Var5 = p_Var4, (Node *)p_Var4->_M_nxt[1]._M_nxt != node)) {
    while (p_Var4 = p_Var2, p_Var2 = p_Var4->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar3) ||
         (p_Var5 = p_Var4, (Node *)p_Var2[1]._M_nxt == node)) goto LAB_008379c3;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_008379c3:
  if (p_Var5 == (__node_base_ptr)0x0) {
    p_Var2 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var2 = p_Var5->_M_nxt;
  }
  if (p_Var2 == (_Hash_node_base *)0x0) {
    if (getUsers(wasm::DataFlow::Node*)::empty == '\0') {
      local_18 = in_RAX;
      getUsers((Users *)&stack0xffffffffffffffe8);
    }
    else {
      local_18 = &getUsers::empty;
    }
  }
  else {
    local_18 = (UserSet *)(p_Var2 + 2);
  }
  return local_18;
}

Assistant:

UserSet& getUsers(Node* node) {
    auto iter = users.find(node);
    if (iter == users.end()) {
      static UserSet empty; // FIXME thread_local?
      return empty;
    }
    return iter->second;
  }